

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O1

void __thiscall
QAbstractItemModelTesterPrivate::columnsAboutToBeMoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *sourceParent,int sourceStart,
          int sourceEnd,QModelIndex *destinationParent,int destinationColumn)

{
  QObject *pQVar1;
  QDebug QVar2;
  quintptr this_00;
  bool bVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QArrayData *local_d0;
  undefined8 *local_c8;
  ChangeInFlight local_b8 [6];
  char *local_a0;
  QDebug local_98;
  undefined1 local_90 [8];
  QDebug local_88;
  QModelIndex local_80;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8[0] = None;
  bVar3 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,local_b8,"changeInFlight","ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x2f5);
  if (bVar3) {
    this->changeInFlight = ColumnsMoved;
    lcModelTest();
    if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_b8[0] = ColumnsMoved;
      local_b8[1] = None;
      local_b8[2] = None;
      local_b8[3] = None;
      local_b8[4] = None;
      local_b8[5] = 0;
      local_a0 = lcModelTest::category.name;
      QMessageLogger::debug();
      QVar2.stream = local_98.stream;
      QVar4.m_data = (storage_type *)0x15;
      QVar4.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar4);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_58);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_98.stream,' ');
      }
      QVar2.stream = local_98.stream;
      QVar5.m_data = (storage_type *)0xc;
      QVar5.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar5);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_58);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_98.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_98.stream,sourceStart);
      if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_98.stream,' ');
      }
      QVar2.stream = local_98.stream;
      QVar6.m_data = (storage_type *)0xa;
      QVar6.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_58);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_98.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_98.stream,sourceEnd);
      if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_98.stream,' ');
      }
      QVar2.stream = local_98.stream;
      QVar7.m_data = (storage_type *)0xd;
      QVar7.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_58);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_98.stream,' ');
      }
      local_90 = (undefined1  [8])local_98.stream;
      *(int *)(local_98.stream + 0x28) = *(int *)(local_98.stream + 0x28) + 1;
      operator<<((Stream *)(local_90 + 8),(QModelIndex *)local_90);
      QVar2.stream = local_88.stream;
      QVar8.m_data = (storage_type *)0x12;
      QVar8.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_58);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.stream,' ');
      }
      pQVar1 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,sourceParent,0);
      QVariant::toString();
      if (local_c8 == (undefined8 *)0x0) {
        local_c8 = &QString::_empty;
      }
      QDebug::putString((QChar *)(local_90 + 8),(ulong)local_c8);
      if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.stream,' ');
      }
      QVar2.stream = local_88.stream;
      QVar9.m_data = (storage_type *)0x12;
      QVar9.m_size = (qsizetype)&local_80.m;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_80.m);
      if ((QArrayData *)local_80.m.ptr != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_80.m.ptr = *(int *)local_80.m.ptr + -1;
        UNLOCK();
        if (*(int *)local_80.m.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_80.m.ptr,2,0x10);
        }
      }
      if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.stream,' ');
      }
      local_80._0_8_ = local_88.stream;
      *(int *)(local_88.stream + 0x28) = *(int *)(local_88.stream + 0x28) + 1;
      operator<<((QDebug)&local_80.i,(QModelIndex *)(local_90 + 0x10));
      this_00 = local_80.i;
      QVar10.m_data = (storage_type *)0x12;
      QVar10.m_size = (qsizetype)&local_80.m;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)this_00,(QString *)&local_80.m);
      if ((QArrayData *)local_80.m.ptr != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_80.m.ptr = *(int *)local_80.m.ptr + -1;
        UNLOCK();
        if (*(int *)local_80.m.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_80.m.ptr,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.i + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.i,' ');
      }
      QTextStream::operator<<((QTextStream *)local_80.i,destinationColumn);
      if (*(QTextStream *)(local_80.i + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.i,' ');
      }
      QDebug::~QDebug((QDebug *)&local_80.i);
      QDebug::~QDebug((QDebug *)(local_90 + 0x10));
      if (local_d0 != (QArrayData *)0x0) {
        LOCK();
        (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_d0,2,0x10);
        }
      }
      QVariant::~QVariant((QVariant *)&local_58);
      QDebug::~QDebug((QDebug *)(local_90 + 8));
      QDebug::~QDebug((QDebug *)local_90);
      QDebug::~QDebug(&local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::columnsAboutToBeMoved(const QModelIndex &sourceParent,
                                                            int sourceStart, int sourceEnd,
                                                            const QModelIndex &destinationParent,
                                                            int destinationColumn)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::ColumnsMoved;

    qCDebug(lcModelTest) << "columnsAboutToBeMoved"
                         << "sourceStart=" << sourceStart << "sourceEnd=" << sourceEnd
                         << "sourceParent=" << sourceParent
                         << "sourceParent data=" << model->data(sourceParent).toString()
                         << "destinationParent=" << destinationParent
                         << "destinationColumn=" << destinationColumn;
}